

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  basic_string_view<char> *arg;
  undefined1 local_f8 [48];
  undefined1 *local_c8;
  char *local_a8;
  size_t sStack_a0;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  char *local_88;
  size_t sStack_80;
  char **local_78;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68 [4];
  undefined1 *local_48;
  basic_string_view<char> local_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  basic_string_view<char> local_28 [2];
  
  local_c8 = local_f8;
  local_48 = &local_89;
  local_40 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1bfe04);
  local_88 = local_40.data_;
  sStack_80 = local_40.size_;
  local_78 = &local_88;
  local_8a = 1;
  local_8b = 1;
  local_8c = 1;
  local_8d = 1;
  local_a8 = local_40.data_;
  sStack_a0 = local_40.size_;
  local_30 = local_68;
  local_28[0].data_ = local_a8;
  local_28[0].size_ = sStack_a0;
  local_68[0] = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)basic_string_view<char>::data(local_28);
  basic_string_view<char>::size(local_28);
  return local_68[0];
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}